

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g12s.c
# Opt level: O0

size_t g12sSign_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  size_t ec_deep_00;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t in_RCX;
  size_t in_RDI;
  size_t m;
  size_t in_stack_ffffffffffffffc8;
  
  ec_deep_00 = in_RDI * 0x28;
  sVar1 = zzMod_deep(in_RDI,in_RDI);
  sVar2 = ecMulA_deep(in_RCX,in_RDI,ec_deep_00,in_stack_ffffffffffffffc8);
  sVar3 = zzMulMod_deep(sVar1);
  sVar1 = utilMax(3,sVar1,sVar2,sVar3);
  return ec_deep_00 + sVar1;
}

Assistant:

static size_t g12sSign_deep(size_t n, size_t f_deep, size_t ec_d, 
	size_t ec_deep)
{
	const size_t m = n;
	return 	O_OF_W(3 * m + 2 * n) +
		utilMax(3,
			zzMod_deep(m, m),
			ecMulA_deep(n, ec_d, ec_deep, n),
			zzMulMod_deep(m));
}